

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineParser.cpp
# Opt level: O2

bool __thiscall CommandLineParser::argumentStartsWith(CommandLineParser *this,string *expected)

{
  __type _Var1;
  string local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  getCurrentArgument_abi_cxx11_(&local_50,this);
  std::__cxx11::string::substr((ulong)&local_30,(ulong)&local_50);
  _Var1 = std::operator==(&local_30,expected);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  return _Var1;
}

Assistant:

bool 
CommandLineParser::argumentStartsWith( const std::string &expected ) const
{
  return getCurrentArgument().substr( 0, expected.length() ) == expected;
}